

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGSpatialSort.cpp
# Opt level: O2

void __thiscall
Assimp::SGSpatialSort::FindPositions
          (SGSpatialSort *this,aiVector3D *pPosition,uint32_t pSG,float pRadius,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults,bool exactMatch)

{
  pointer puVar1;
  pointer pEVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  float *pfVar7;
  uint uVar8;
  pointer pEVar9;
  float fVar10;
  float fVar11;
  aiVector3t<float> aVar12;
  
  fVar10 = ::operator*(pPosition,&this->mPlaneNormal);
  puVar1 = (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pEVar9 = (this->mPositions).
           super__Vector_base<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->mPositions).
           super__Vector_base<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((pEVar9 != pEVar2) && (fVar11 = fVar10 + pRadius, pEVar9->mDistance <= fVar11)) &&
     (fVar10 = fVar10 - pRadius, fVar10 < pEVar2[-1].mDistance || fVar10 == pEVar2[-1].mDistance)) {
    uVar3 = ((long)pEVar2 - (long)pEVar9) / 0x18;
    uVar4 = uVar3 >> 1 & 0x7fffffff;
    uVar6 = uVar3 >> 2 & 0x3fffffff;
    while (uVar5 = (uint)uVar6, 1 < uVar5) {
      uVar8 = uVar5;
      if (fVar10 < pEVar9[uVar4].mDistance || fVar10 == pEVar9[uVar4].mDistance) {
        uVar8 = -uVar5;
      }
      uVar4 = (ulong)((int)uVar4 + uVar8);
      uVar6 = (ulong)(uVar5 >> 1);
    }
    pfVar7 = &pEVar9[uVar4].mDistance;
    while (uVar4 != 0) {
      if (*pfVar7 <= fVar10) goto LAB_005e1b41;
      pfVar7 = pfVar7 + -6;
      uVar4 = uVar4 - 1;
    }
    uVar4 = 0;
LAB_005e1b41:
    do {
      uVar6 = uVar4 & 0xffffffff;
      if (uVar3 - 1 <= uVar6) break;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (pEVar9[uVar6].mDistance <= fVar10 && fVar10 != pEVar9[uVar6].mDistance);
    fVar10 = pRadius * pRadius;
    pEVar9 = pEVar9 + uVar6;
    if (exactMatch) {
      do {
        if (fVar11 < pEVar9->mDistance || fVar11 == pEVar9->mDistance) {
          return;
        }
        aVar12 = operator-(&pEVar9->mPosition,pPosition);
        if ((aVar12.z * aVar12.z + aVar12.x * aVar12.x + aVar12.y * aVar12.y < fVar10) &&
           (pEVar9->mSmoothGroups == pSG)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (poResults,&pEVar9->mIndex);
        }
        pEVar9 = pEVar9 + 1;
      } while (pEVar9 != pEVar2);
    }
    else if (pSG == 0) {
      do {
        if (fVar11 < pEVar9->mDistance || fVar11 == pEVar9->mDistance) {
          return;
        }
        aVar12 = operator-(&pEVar9->mPosition,pPosition);
        if (aVar12.z * aVar12.z + aVar12.x * aVar12.x + aVar12.y * aVar12.y < fVar10) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (poResults,&pEVar9->mIndex);
        }
        pEVar9 = pEVar9 + 1;
      } while (pEVar9 != pEVar2);
    }
    else {
      do {
        if (fVar11 < pEVar9->mDistance || fVar11 == pEVar9->mDistance) {
          return;
        }
        aVar12 = operator-(&pEVar9->mPosition,pPosition);
        if ((aVar12.z * aVar12.z + aVar12.x * aVar12.x + aVar12.y * aVar12.y < fVar10) &&
           (pEVar9->mSmoothGroups == 0 || (pEVar9->mSmoothGroups & pSG) != 0)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (poResults,&pEVar9->mIndex);
        }
        pEVar9 = pEVar9 + 1;
      } while (pEVar9 != pEVar2);
    }
  }
  return;
}

Assistant:

void SGSpatialSort::FindPositions( const aiVector3D& pPosition,
    uint32_t pSG,
    float pRadius,
    std::vector<unsigned int>& poResults,
    bool exactMatch /*= false*/) const
{
    float dist = pPosition * mPlaneNormal;
    float minDist = dist - pRadius, maxDist = dist + pRadius;

    // clear the array
    poResults.clear();

    // quick check for positions outside the range
    if( mPositions.empty() )
        return;
    if( maxDist < mPositions.front().mDistance)
        return;
    if( minDist > mPositions.back().mDistance)
        return;

    // do a binary search for the minimal distance to start the iteration there
    unsigned int index = (unsigned int)mPositions.size() / 2;
    unsigned int binaryStepSize = (unsigned int)mPositions.size() / 4;
    while( binaryStepSize > 1)
    {
        if( mPositions[index].mDistance < minDist)
            index += binaryStepSize;
        else
            index -= binaryStepSize;

        binaryStepSize /= 2;
    }

    // depending on the direction of the last step we need to single step a bit back or forth
    // to find the actual beginning element of the range
    while( index > 0 && mPositions[index].mDistance > minDist)
        index--;
    while( index < (mPositions.size() - 1) && mPositions[index].mDistance < minDist)
        index++;

    // Mow start iterating from there until the first position lays outside of the distance range.
    // Add all positions inside the distance range within the given radius to the result aray

    float squareEpsilon = pRadius * pRadius;
    std::vector<Entry>::const_iterator it  = mPositions.begin() + index;
    std::vector<Entry>::const_iterator end = mPositions.end();

    if (exactMatch)
    {
        while( it->mDistance < maxDist)
        {
            if((it->mPosition - pPosition).SquareLength() < squareEpsilon && it->mSmoothGroups == pSG)
            {
                poResults.push_back( it->mIndex);
            }
            ++it;
            if( end == it )break;
        }
    }
    else
    {
        // if the given smoothing group is 0, we'll return all surrounding vertices
        if (!pSG)
        {
            while( it->mDistance < maxDist)
            {
                if((it->mPosition - pPosition).SquareLength() < squareEpsilon)
                    poResults.push_back( it->mIndex);
                ++it;
                if( end == it)break;
            }
        }
        else while( it->mDistance < maxDist)
        {
            if((it->mPosition - pPosition).SquareLength() < squareEpsilon &&
                (it->mSmoothGroups & pSG || !it->mSmoothGroups))
            {
                poResults.push_back( it->mIndex);
            }
            ++it;
            if( end == it)break;
        }
    }
}